

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplicialCholesky_impl.h
# Opt level: O0

void __thiscall
Eigen::
SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
::analyzePattern_preordered
          (SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
           *this,CholMatrixType *ap,bool doLDLT)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  Index IVar4;
  Scalar *pSVar5;
  char *pcVar6;
  StorageIndex *pSVar7;
  int __c;
  Index *pIVar8;
  CholMatrixType *__s;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  StorageIndex SVar9;
  PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff10;
  Index in_stack_ffffffffffffff18;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffff20;
  undefined1 *local_b0;
  int local_9c;
  StorageIndex k_1;
  StorageIndex *Lp;
  undefined1 local_88 [4];
  StorageIndex i;
  InnerIterator it;
  int local_4c;
  StorageIndex k;
  aligned_stack_memory_handler<int> tags_stack_memory_destructor;
  StorageIndex *tags;
  StorageIndex size;
  bool doLDLT_local;
  CholMatrixType *ap_local;
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  *this_local;
  
  pIVar8 = (Index *)&stack0xffffffffffffff08;
  IVar4 = SparseMatrix<double,_0,_int>::rows(ap);
  iVar3 = (int)IVar4;
  SparseMatrix<double,_0,_int>::resize
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(Index)in_stack_ffffffffffffff10);
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (in_stack_ffffffffffffff10,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
            );
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (in_stack_ffffffffffffff10,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
            );
  if (0x3fffffffffffffff < (ulong)(long)iVar3) {
    internal::throw_std_bad_alloc();
  }
  if ((ulong)((long)iVar3 * 4) < 0x20001) {
    lVar1 = -((long)iVar3 * 4 + 0x1eU & 0xfffffffffffffff0);
    pIVar8 = (Index *)(&stack0xffffffffffffff08 + lVar1);
    local_b0 = &stack0xffffffffffffff10 + lVar1;
  }
  else {
    local_b0 = (undefined1 *)internal::aligned_malloc((size_t)in_stack_ffffffffffffff10);
  }
  pIVar8[-1] = 0x1e0803;
  internal::aligned_stack_memory_handler<int>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<int> *)pIVar8[3],(int *)pIVar8[2],pIVar8[1],
             *(bool *)((long)pIVar8 + 7));
  for (local_4c = 0; local_4c < iVar3; local_4c = local_4c + 1) {
    pIVar8[-1] = 0x1e082a;
    pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)pIVar8[1],*pIVar8
                       );
    *pSVar5 = -1;
    *(int *)(local_b0 + (long)local_4c * 4) = local_4c;
    pIVar8[-1] = 0x1e0861;
    pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)pIVar8[1],*pIVar8
                       );
    *pSVar5 = 0;
    pIVar8[-1] = 0x1e0888;
    __s = ap;
    SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::InnerIterator
              ((InnerIterator *)pIVar8[3],
               (SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_> *)pIVar8[2],pIVar8[1]);
    while( true ) {
      pIVar8[-1] = 0x1e0895;
      bVar2 = SparseCompressedBase::InnerIterator::operator_cast_to_bool((InnerIterator *)local_88);
      if (!bVar2) break;
      pIVar8[-1] = 0x1e08a7;
      pcVar6 = SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::index
                         ((InnerIterator *)local_88,(char *)__s,__c);
      Lp._4_4_ = (Scalar)pcVar6;
      if (Lp._4_4_ < local_4c) {
        while (*(int *)(local_b0 + (long)Lp._4_4_ * 4) != local_4c) {
          pIVar8[-1] = 0x1e08ec;
          pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)pIVar8[1],
                              *pIVar8);
          if (*pSVar5 == -1) {
            pIVar8[-1] = 0x1e0921;
            pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)pIVar8[1]
                                ,*pIVar8);
            *pSVar5 = local_4c;
          }
          pIVar8[-1] = 0x1e096c;
          pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)pIVar8[1],
                              *pIVar8);
          *pSVar5 = *pSVar5 + 1;
          *(int *)(local_b0 + (long)Lp._4_4_ * 4) = local_4c;
          __s = (CholMatrixType *)(long)Lp._4_4_;
          pIVar8[-1] = 0x1e09ab;
          pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)pIVar8[1],
                              *pIVar8);
          Lp._4_4_ = *pSVar5;
        }
      }
      pIVar8[-1] = 0x1e09d5;
      SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::operator++
                ((InnerIterator *)local_88);
    }
  }
  pIVar8[-1] = 0x1e09fa;
  pSVar7 = SparseMatrix<double,_0,_int>::outerIndexPtr(&this->m_matrix);
  *pSVar7 = 0;
  for (local_9c = 0; local_9c < iVar3; local_9c = local_9c + 1) {
    SVar9 = pSVar7[local_9c];
    pIVar8[-1] = 0x1e0a4a;
    pSVar5 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)pIVar8[1],*pIVar8
                       );
    pSVar7[local_9c + 1] = SVar9 + *pSVar5 + (uint)!doLDLT;
  }
  pIVar8[-1] = 0x1e0abf;
  SparseMatrix<double,_0,_int>::resizeNonZeros((SparseMatrix<double,_0,_int> *)pIVar8[1],*pIVar8);
  (this->
  super_SparseSolverBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  ).m_isInitialized = true;
  this->m_info = Success;
  this->m_analysisIsOk = true;
  this->m_factorizationIsOk = false;
  pIVar8[-1] = 0x1e0ae3;
  internal::aligned_stack_memory_handler<int>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<int> *)pIVar8[1]);
  return;
}

Assistant:

void SimplicialCholeskyBase<Derived>::analyzePattern_preordered(const CholMatrixType& ap, bool doLDLT)
{
  const StorageIndex size = StorageIndex(ap.rows());
  m_matrix.resize(size, size);
  m_parent.resize(size);
  m_nonZerosPerCol.resize(size);

  ei_declare_aligned_stack_constructed_variable(StorageIndex, tags, size, 0);

  for(StorageIndex k = 0; k < size; ++k)
  {
    /* L(k,:) pattern: all nodes reachable in etree from nz in A(0:k-1,k) */
    m_parent[k] = -1;             /* parent of k is not yet known */
    tags[k] = k;                  /* mark node k as visited */
    m_nonZerosPerCol[k] = 0;      /* count of nonzeros in column k of L */
    for(typename CholMatrixType::InnerIterator it(ap,k); it; ++it)
    {
      StorageIndex i = it.index();
      if(i < k)
      {
        /* follow path from i to root of etree, stop at flagged node */
        for(; tags[i] != k; i = m_parent[i])
        {
          /* find parent of i if not yet determined */
          if (m_parent[i] == -1)
            m_parent[i] = k;
          m_nonZerosPerCol[i]++;        /* L (k,i) is nonzero */
          tags[i] = k;                  /* mark i as visited */
        }
      }
    }
  }

  /* construct Lp index array from m_nonZerosPerCol column counts */
  StorageIndex* Lp = m_matrix.outerIndexPtr();
  Lp[0] = 0;
  for(StorageIndex k = 0; k < size; ++k)
    Lp[k+1] = Lp[k] + m_nonZerosPerCol[k] + (doLDLT ? 0 : 1);

  m_matrix.resizeNonZeros(Lp[size]);

  m_isInitialized     = true;
  m_info              = Success;
  m_analysisIsOk      = true;
  m_factorizationIsOk = false;
}